

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FilereaderMps.cpp
# Opt level: O0

HighsStatus __thiscall
FilereaderMps::writeModelToFile
          (FilereaderMps *this,HighsOptions *options,string *filename,HighsModel *model)

{
  HighsStatus HVar1;
  string *in_RDX;
  undefined1 in_stack_00000257;
  HighsModel *in_stack_00000258;
  string *in_stack_00000260;
  HighsOptions *in_stack_00000268;
  string local_40 [64];
  
  std::__cxx11::string::string(local_40,in_RDX);
  HVar1 = writeModelAsMps(in_stack_00000268,in_stack_00000260,in_stack_00000258,
                          (bool)in_stack_00000257);
  std::__cxx11::string::~string(local_40);
  return HVar1;
}

Assistant:

HighsStatus FilereaderMps::writeModelToFile(const HighsOptions& options,
                                            const std::string filename,
                                            const HighsModel& model) {
  assert(model.lp_.a_matrix_.isColwise());
  return writeModelAsMps(options, filename, model,
                         options.mps_parser_type_free);
}